

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O1

void __thiscall icu_63::double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  uint *puVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  if (factor != 1) {
    if (factor == 0) {
      if (0 < this->used_digits_) {
        puVar1 = (this->bigits_).start_;
        lVar5 = 0;
        do {
          puVar1[lVar5] = 0;
          lVar5 = lVar5 + 1;
        } while (lVar5 < this->used_digits_);
      }
      this->used_digits_ = 0;
      this->exponent_ = 0;
    }
    else {
      if (this->used_digits_ < 1) {
        uVar4 = 0;
      }
      else {
        puVar1 = (this->bigits_).start_;
        lVar5 = 0;
        uVar4 = 0;
        do {
          uVar3 = (ulong)puVar1[lVar5];
          uVar6 = (ulong)((uint)uVar4 & 0xfffffff) + (factor & 0xffffffff) * uVar3;
          puVar1[lVar5] = (uint)uVar6 & 0xfffffff;
          uVar4 = uVar3 * (factor >> 0x1c & 0xfffffffffffffff0) + (uVar4 >> 0x1c) + (uVar6 >> 0x1c);
          lVar5 = lVar5 + 1;
        } while (lVar5 < this->used_digits_);
      }
      if (uVar4 != 0) {
        puVar1 = (this->bigits_).start_;
        do {
          if (0x7f < (long)this->used_digits_) {
            abort();
          }
          puVar1[this->used_digits_] = (uint)uVar4 & 0xfffffff;
          this->used_digits_ = this->used_digits_ + 1;
          bVar2 = 0xfffffff < uVar4;
          uVar4 = uVar4 >> 0x1c;
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(uint64_t factor) {
  if (factor == 1) return;
  if (factor == 0) {
    Zero();
    return;
  }
  ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  uint64_t low = factor & 0xFFFFFFFF;
  uint64_t high = factor >> 32;
  for (int i = 0; i < used_digits_; ++i) {
    uint64_t product_low = low * bigits_[i];
    uint64_t product_high = high * bigits_[i];
    uint64_t tmp = (carry & kBigitMask) + product_low;
    bigits_[i] = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_digits_ + 1);
    bigits_[used_digits_] = carry & kBigitMask;
    used_digits_++;
    carry >>= kBigitSize;
  }
}